

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get_value<std::__cxx11::string>
          (Attribute *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ret;
  anon_struct_8_0_00000001_for___align local_68;
  undefined8 local_60;
  long local_58;
  undefined8 uStack_50;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  if (v == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_48.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::__cxx11::string>(&local_48,&this->_var);
    if (local_48.has_value_ == true) {
      if (local_48.contained.data.__align ==
          (anon_struct_8_0_00000001_for___align)((long)&local_48.contained + 0x10)) {
        uStack_50 = local_48.contained._24_8_;
        local_68 = (anon_struct_8_0_00000001_for___align)&local_58;
      }
      else {
        local_68 = local_48.contained.data.__align;
      }
      local_58 = local_48.contained._16_8_;
      local_60 = local_48.contained._8_8_;
      std::__cxx11::string::operator=((string *)v,(string *)&local_68);
    }
    if (((local_48.has_value_ & 1U) != 0) &&
       (local_68 != (anon_struct_8_0_00000001_for___align)&local_58)) {
      operator_delete((void *)local_68,local_58 + 1);
    }
  }
  return local_48.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }